

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O2

void __thiscall
PSVIWriterHandlers::processFacets
          (PSVIWriterHandlers *this,XSFacetList *facets,XSMultiValueFacetList *multiFacets)

{
  BaseRefVectorOf<char16_t> *this_00;
  uint uVar1;
  XSFacet *pXVar2;
  XMLCh *pXVar3;
  XSMultiValueFacet *pXVar4;
  char16_t *value;
  PSVIWriterHandlers *pPVar5;
  uint uVar6;
  
  if (facets == (XSFacetList *)0x0 && multiFacets == (XSMultiValueFacetList *)0x0) {
    sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacets);
    return;
  }
  sendIndentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacets);
  if (facets != (XSFacetList *)0x0) {
    for (uVar6 = 0; (ulong)uVar6 < *(ulong *)(facets + 0x10); uVar6 = uVar6 + 1) {
      pPVar5 = (PSVIWriterHandlers *)facets;
      pXVar2 = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSFacet>::elementAt
                         ((BaseRefVectorOf<xercesc_4_0::XSFacet> *)facets,(ulong)uVar6);
      pXVar3 = translateFacet(pPVar5,*(FACET *)(pXVar2 + 0x28));
      sendIndentedElement(this,pXVar3);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValue,*(XMLCh **)(pXVar2 + 0x30));
      pXVar3 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
      if (pXVar2[0x2c] != (XSFacet)0x0) {
        pXVar3 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
      }
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacetFixed,pXVar3);
      pPVar5 = this;
      processAnnotation(this,*(XSAnnotation **)(pXVar2 + 0x38));
      pXVar3 = translateFacet(pPVar5,*(FACET *)(pXVar2 + 0x28));
      sendUnindentedElement(this,pXVar3);
    }
  }
  if (multiFacets != (XSMultiValueFacetList *)0x0) {
    for (uVar6 = 0; (ulong)uVar6 < *(ulong *)(multiFacets + 0x10); uVar6 = uVar6 + 1) {
      pPVar5 = (PSVIWriterHandlers *)multiFacets;
      pXVar4 = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet>::elementAt
                         ((BaseRefVectorOf<xercesc_4_0::XSMultiValueFacet> *)multiFacets,
                          (ulong)uVar6);
      pXVar3 = translateFacet(pPVar5,*(FACET *)(pXVar4 + 0x28));
      sendIndentedElement(this,pXVar3);
      this_00 = *(BaseRefVectorOf<char16_t> **)(pXVar4 + 0x30);
      for (uVar1 = 0; (ulong)uVar1 < this_00->fCurCount; uVar1 = uVar1 + 1) {
        value = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(this_00,(ulong)uVar1);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValue,value);
      }
      pXVar3 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
      if (pXVar4[0x2c] != (XSMultiValueFacet)0x0) {
        pXVar3 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
      }
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacetFixed,pXVar3);
      pPVar5 = this;
      processAnnotations(this,*(XSAnnotationList **)(pXVar4 + 0x38));
      pXVar3 = translateFacet(pPVar5,*(FACET *)(pXVar4 + 0x28));
      sendUnindentedElement(this,pXVar3);
    }
  }
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgFacets);
  return;
}

Assistant:

void PSVIWriterHandlers::processFacets(XSFacetList* facets, XSMultiValueFacetList* multiFacets) {
	if (facets == NULL && multiFacets == NULL) {
		sendElementEmpty(PSVIUni::fgFacets);
	} else {
		sendIndentedElement(PSVIUni::fgFacets);
		if (facets != NULL) {
			for (unsigned int facetCount = 0; facetCount < facets->size(); facetCount++) {
				XSFacet* facet = facets->elementAt(facetCount);
				sendIndentedElement(translateFacet(facet->getFacetKind()));
				sendElementValue(PSVIUni::fgValue, facet->getLexicalFacetValue());
				sendElementValue(PSVIUni::fgFacetFixed, translateBool(facet->isFixed()));
				processAnnotation(facet->getAnnotation());
				sendUnindentedElement(translateFacet(facet->getFacetKind()));
			}
		}
		if (multiFacets != NULL) {
			for (unsigned int multiFacetCount = 0; multiFacetCount < multiFacets->size(); multiFacetCount++) {
				XSMultiValueFacet* multiFacet = multiFacets->elementAt(multiFacetCount);
				sendIndentedElement(translateFacet(multiFacet->getFacetKind()));
				StringList* values = multiFacet->getLexicalFacetValues();
				for (unsigned int i=0; i < values->size(); i++) {
					sendElementValue(PSVIUni::fgValue, values->elementAt(i));
				}
				sendElementValue(PSVIUni::fgFacetFixed, translateBool(multiFacet->isFixed()));
				processAnnotations(multiFacet->getAnnotations());
				sendUnindentedElement(translateFacet(multiFacet->getFacetKind()));
			}
		}
		sendUnindentedElement(PSVIUni::fgFacets);
	}
}